

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_rsa_sha2_512_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  EVP_MD_CTX *ctx;
  uchar **local_90;
  size_t *local_88;
  EVP_PKEY *local_80;
  uchar hash [64];
  
  local_80 = (EVP_PKEY *)*abstract;
  iVar1 = _libssh2_sha512_init(&ctx);
  if (iVar1 != 0) {
    uVar3 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar3 = 0;
    }
    uVar2 = 0;
    local_90 = signature;
    local_88 = signature_len;
    do {
      if (uVar3 * 0x10 + 0x10 == uVar2 + 0x10) {
        iVar1 = _libssh2_sha512_final(&ctx,hash);
        if (iVar1 == 0) {
          return -1;
        }
        iVar1 = _libssh2_rsa_sha2_sign(session,local_80,hash,0x40,local_90,local_88);
        return -(uint)(iVar1 != 0);
      }
      iVar1 = _libssh2_sha512_update
                        (&ctx,*(void **)((long)&datavec->iov_base + uVar2),
                         *(size_t *)((long)&datavec->iov_len + uVar2));
      uVar2 = uVar2 + 0x10;
    } while (iVar1 != 0);
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_rsa_sha2_512_signv(LIBSSH2_SESSION * session,
                                      unsigned char **signature,
                                      size_t *signature_len,
                                      int veccount,
                                      const struct iovec datavec[],
                                      void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha2_512_signv
    return _libssh2_rsa_sha2_512_signv(session, signature, signature_len,
                                       veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA512_DIGEST_LENGTH];
    libssh2_sha512_ctx ctx;

    if(!libssh2_sha512_init(&ctx)) {
        return -1;
    }
    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha512_update(ctx,
                                  datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha512_final(ctx, hash)) {
        return -1;
    }

    ret = _libssh2_rsa_sha2_sign(session, rsactx, hash, SHA512_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}